

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O2

QString * __thiscall
DumpWrapperToFileCommand::makeFileName
          (QString *__return_storage_ptr__,DumpWrapperToFileCommand *this,offset_t wrapperOffset)

{
  ostream *poVar1;
  stringstream sstr;
  char *local_1c0 [4];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"wrapper");
  if (wrapperOffset != 0xffffffffffffffff) {
    poVar1 = std::operator<<(local_190,"_at_");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::operator<<(local_190,".bin");
  std::__cxx11::stringbuf::str();
  QString::QString(__return_storage_ptr__,local_1c0[0]);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

QString makeFileName(const offset_t wrapperOffset) 
    {
        std::stringstream sstr;
        sstr << "wrapper";
        if (wrapperOffset != INVALID_ADDR) {
            sstr << "_at_" << std::hex << wrapperOffset;
        }
        sstr << ".bin";
        return QString(sstr.str().c_str());
    }